

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_3dmView::Read(ON_3dmView *this,ON_BinaryArchive *file)

{
  ON_3dPoint target_point;
  ViewSectionBehavior behavior;
  bool bVar1;
  v3_display_mode dm_00;
  int iVar2;
  uint uVar3;
  view_type vVar4;
  wchar_t *full_path;
  ON_UUID OVar5;
  bool local_11a;
  ON_3dPoint local_d8;
  byte local_b9;
  undefined1 local_b8 [7];
  uchar c;
  ON_BoundingBox obsolete_nested_view_position;
  ON_UUID obsolete_parent_viewport_id;
  int minor_version;
  int major_version;
  uchar local_68 [8];
  v3_display_mode dm;
  ON_wString local_50;
  ON_wString bitmap_filename;
  bool rc;
  long lStack_40;
  int i32;
  ON__INT64 big_value;
  undefined1 auStack_30 [4];
  uint tcode;
  ON_3dPoint obsolete_target_point;
  ON_BinaryArchive *file_local;
  ON_3dmView *this_local;
  
  _auStack_30 = ON_3dPoint::UnsetPoint.x;
  obsolete_target_point.x = ON_3dPoint::UnsetPoint.y;
  obsolete_target_point.y = ON_3dPoint::UnsetPoint.z;
  big_value._4_4_ = 0;
  lStack_40 = 0;
  bitmap_filename.m_s._3_1_ = 1;
  obsolete_target_point.z = (double)file;
  Default(this);
  do {
    if (((bitmap_filename.m_s._3_1_ & 1) == 0) ||
       (bitmap_filename.m_s._3_1_ =
             ON_BinaryArchive::BeginRead3dmBigChunk
                       ((ON_BinaryArchive *)obsolete_target_point.z,(uint *)((long)&big_value + 4),
                        &stack0xffffffffffffffc0), !(bool)bitmap_filename.m_s._3_1_)) break;
    if (big_value._4_4_ == -0x5ffffcc5) {
      this->m_bShowConstructionGrid = (bool)(-(lStack_40 != 0) & 1);
    }
    else if (big_value._4_4_ == -0x5ffffbc5) {
      this->m_bShowConstructionAxes = (bool)(-(lStack_40 != 0) & 1);
    }
    else if (big_value._4_4_ == -0x5ffffac5) {
      this->m_bShowWorldAxes = (bool)(-(lStack_40 != 0) & 1);
    }
    else if (big_value._4_4_ == -0x5ffff6c5) {
      bVar1 = ::operator==(&ON_nil_uuid,&this->m_display_mode_id);
      if (bVar1) {
        bitmap_filename.m_s._4_4_ = (int)lStack_40;
        dm_00 = ON::V3DisplayMode(bitmap_filename.m_s._4_4_);
        OVar5 = ON_StandardDisplayModeId::FromV3DisplayMode(dm_00);
        _minor_version = OVar5._0_8_;
        (this->m_display_mode_id).Data1 = minor_version;
        (this->m_display_mode_id).Data2 = (undefined2)major_version;
        (this->m_display_mode_id).Data3 = major_version._2_2_;
        local_68 = OVar5.Data4;
        *&(this->m_display_mode_id).Data4 = local_68;
      }
    }
    else if (big_value._4_4_ == 0x2000813b) {
      bitmap_filename.m_s._3_1_ =
           ON_3dmConstructionPlane::Read
                     (&this->m_cplane,(ON_BinaryArchive *)obsolete_target_point.z);
    }
    else if (big_value._4_4_ == 0x2000823b) {
      bVar1 = ON_Viewport::Read(&this->m_vp,(ON_BinaryArchive *)obsolete_target_point.z);
      bitmap_filename.m_s._3_1_ = -bVar1 & 1;
    }
    else if (big_value._4_4_ == 0x2000863b) {
      bitmap_filename.m_s._3_1_ =
           ON_3dmViewTraceImage::Read
                     (&this->m_trace_image,(ON_BinaryArchive *)obsolete_target_point.z);
    }
    else if (big_value._4_4_ == 0x2000873b) {
      ON_wString::ON_wString(&local_50);
      bitmap_filename.m_s._3_1_ =
           ON_BinaryArchive::ReadString((ON_BinaryArchive *)obsolete_target_point.z,&local_50);
      full_path = ON_wString::operator_cast_to_wchar_t_(&local_50);
      ON_FileReference::SetFullPath
                (&(this->m_wallpaper_image).m_image_file_reference,full_path,false);
      ON_wString::~ON_wString(&local_50);
      (this->m_wallpaper_image).m_bGrayScale = true;
    }
    else if (big_value._4_4_ == 0x2000874b) {
      bitmap_filename.m_s._3_1_ =
           ON_3dmWallpaperImage::Read
                     (&this->m_wallpaper_image,(ON_BinaryArchive *)obsolete_target_point.z);
    }
    else if (big_value._4_4_ == 0x2000883b) {
      bitmap_filename.m_s._3_1_ =
           ON_BinaryArchive::ReadPoint
                     ((ON_BinaryArchive *)obsolete_target_point.z,(ON_3dPoint *)auStack_30);
    }
    else if (big_value._4_4_ == 0x20008a3b) {
      bitmap_filename.m_s._3_1_ =
           ON_BinaryArchive::ReadString((ON_BinaryArchive *)obsolete_target_point.z,&this->m_name);
    }
    else if (big_value._4_4_ == 0x20008b3b) {
      bitmap_filename.m_s._3_1_ =
           ON_3dmViewPosition::Read(&this->m_position,(ON_BinaryArchive *)obsolete_target_point.z);
    }
    else if (big_value._4_4_ == 0x20008c3b) {
      obsolete_parent_viewport_id.Data4[4] = '\0';
      obsolete_parent_viewport_id.Data4[5] = '\0';
      obsolete_parent_viewport_id.Data4[6] = '\0';
      obsolete_parent_viewport_id.Data4[7] = '\0';
      obsolete_parent_viewport_id.Data4[0] = '\0';
      obsolete_parent_viewport_id.Data4[1] = '\0';
      obsolete_parent_viewport_id.Data4[2] = '\0';
      obsolete_parent_viewport_id.Data4[3] = '\0';
      bitmap_filename.m_s._3_1_ =
           ON_BinaryArchive::Read3dmChunkVersion
                     ((ON_BinaryArchive *)obsolete_target_point.z,
                      (int *)(obsolete_parent_viewport_id.Data4 + 4),
                      (int *)obsolete_parent_viewport_id.Data4);
      bVar1 = false;
      if ((((bool)bitmap_filename.m_s._3_1_) &&
          (bVar1 = false, obsolete_parent_viewport_id.Data4._4_4_ == 1)) &&
         (bVar1 = false, 0 < (int)obsolete_parent_viewport_id.Data4._0_4_)) {
        iVar2 = ON_BinaryArchive::Archive3dmVersion((ON_BinaryArchive *)obsolete_target_point.z);
        bVar1 = false;
        if (3 < iVar2) {
          uVar3 = ON_BinaryArchive::ArchiveOpenNURBSVersion
                            ((ON_BinaryArchive *)obsolete_target_point.z);
          bVar1 = 0xbf36f81 < uVar3;
        }
      }
      if (bVar1) {
        bitmap_filename.m_s._4_4_ = 0;
        bitmap_filename.m_s._3_1_ =
             ON_BinaryArchive::ReadInt
                       ((ON_BinaryArchive *)obsolete_target_point.z,
                        (ON__INT32 *)((long)&bitmap_filename.m_s + 4));
        if ((bool)bitmap_filename.m_s._3_1_) {
          vVar4 = ON::ViewType(bitmap_filename.m_s._4_4_);
          this->m_view_type = vVar4;
          bitmap_filename.m_s._3_1_ =
               ON_BinaryArchive::ReadDouble
                         ((ON_BinaryArchive *)obsolete_target_point.z,
                          &(this->m_page_settings).m_width_mm);
          if ((((bool)bitmap_filename.m_s._3_1_) &&
              (bitmap_filename.m_s._3_1_ =
                    ON_BinaryArchive::ReadDouble
                              ((ON_BinaryArchive *)obsolete_target_point.z,
                               &(this->m_page_settings).m_height_mm),
              (bool)bitmap_filename.m_s._3_1_)) &&
             (bitmap_filename.m_s._3_1_ =
                   ON_BinaryArchive::ReadUuid
                             ((ON_BinaryArchive *)obsolete_target_point.z,
                              (ON_UUID *)&obsolete_nested_view_position.m_max.z),
             (bool)bitmap_filename.m_s._3_1_)) {
            ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)local_b8);
            bitmap_filename.m_s._3_1_ =
                 ON_BinaryArchive::ReadBoundingBox
                           ((ON_BinaryArchive *)obsolete_target_point.z,(ON_BoundingBox *)local_b8);
            if (((((bool)bitmap_filename.m_s._3_1_) &&
                 (1 < (int)obsolete_parent_viewport_id.Data4._0_4_)) &&
                ((bitmap_filename.m_s._3_1_ =
                       ON_BinaryArchive::ReadUuid
                                 ((ON_BinaryArchive *)obsolete_target_point.z,
                                  &this->m_display_mode_id), (bool)bitmap_filename.m_s._3_1_ &&
                 ((((bitmap_filename.m_s._3_1_ =
                          ON_3dmPageSettings::Read
                                    (&this->m_page_settings,
                                     (ON_BinaryArchive *)obsolete_target_point.z),
                    (bool)bitmap_filename.m_s._3_1_ &&
                    (2 < (int)obsolete_parent_viewport_id.Data4._0_4_)) &&
                   (bitmap_filename.m_s._3_1_ =
                         ON_BinaryArchive::ReadBool
                                   ((ON_BinaryArchive *)obsolete_target_point.z,
                                    &this->m_bLockedProjection), (bool)bitmap_filename.m_s._3_1_))
                  && ((3 < (int)obsolete_parent_viewport_id.Data4._0_4_ &&
                      (bitmap_filename.m_s._3_1_ =
                            ON_BinaryArchive::ReadArray
                                      ((ON_BinaryArchive *)obsolete_target_point.z,
                                       &this->m_clipping_planes), (bool)bitmap_filename.m_s._3_1_)))
                  ))))) &&
               (((4 < (int)obsolete_parent_viewport_id.Data4._0_4_ &&
                 ((bitmap_filename.m_s._3_1_ =
                        ON_BinaryArchive::ReadUuid
                                  ((ON_BinaryArchive *)obsolete_target_point.z,
                                   &this->m_named_view_id), (bool)bitmap_filename.m_s._3_1_ &&
                  (5 < (int)obsolete_parent_viewport_id.Data4._0_4_)))) &&
                (((((bitmap_filename.m_s._3_1_ =
                          ON_BinaryArchive::ReadBool
                                    ((ON_BinaryArchive *)obsolete_target_point.z,
                                     &this->m_bShowConstructionZAxis),
                    (bool)bitmap_filename.m_s._3_1_ &&
                    (((6 < (int)obsolete_parent_viewport_id.Data4._0_4_ &&
                      (bitmap_filename.m_s._3_1_ =
                            ON_BinaryArchive::ReadDouble
                                      ((ON_BinaryArchive *)obsolete_target_point.z,
                                       &this->m_dFocalBlurDistance), (bool)bitmap_filename.m_s._3_1_
                      )) && (bitmap_filename.m_s._3_1_ =
                                  ON_BinaryArchive::ReadDouble
                                            ((ON_BinaryArchive *)obsolete_target_point.z,
                                             &this->m_dFocalBlurAperture),
                            (bool)bitmap_filename.m_s._3_1_)))) &&
                   (((bitmap_filename.m_s._3_1_ =
                           ON_BinaryArchive::ReadDouble
                                     ((ON_BinaryArchive *)obsolete_target_point.z,
                                      &this->m_dFocalBlurJitter), (bool)bitmap_filename.m_s._3_1_ &&
                     (bitmap_filename.m_s._3_1_ =
                           ON_BinaryArchive::ReadInt
                                     ((ON_BinaryArchive *)obsolete_target_point.z,
                                      (ON__INT32 *)&this->m_uFocalBlurSampleCount),
                     (bool)bitmap_filename.m_s._3_1_)) &&
                    (bitmap_filename.m_s._3_1_ =
                          ON_BinaryArchive::ReadInt
                                    ((ON_BinaryArchive *)obsolete_target_point.z,
                                     (ON__INT32 *)&this->m_FocalBlurMode),
                    (bool)bitmap_filename.m_s._3_1_)))) &&
                  (((int)obsolete_parent_viewport_id.Data4._0_4_ < 8 ||
                   ((bitmap_filename.m_s._3_1_ =
                          ON_BinaryArchive::ReadInt
                                    ((ON_BinaryArchive *)obsolete_target_point.z,
                                     &(this->m_sizeRendering).cx), (bool)bitmap_filename.m_s._3_1_
                    && (bitmap_filename.m_s._3_1_ =
                             ON_BinaryArchive::ReadInt
                                       ((ON_BinaryArchive *)obsolete_target_point.z,
                                        &(this->m_sizeRendering).cy),
                       (bool)bitmap_filename.m_s._3_1_)))))) &&
                 (8 < (int)obsolete_parent_viewport_id.Data4._0_4_)))))) {
              local_b9 = 0;
              bitmap_filename.m_s._3_1_ =
                   ON_BinaryArchive::ReadChar((ON_BinaryArchive *)obsolete_target_point.z,&local_b9)
              ;
              if ((bool)bitmap_filename.m_s._3_1_) {
                behavior = ON::ViewSectionBehaviorFromUnsigned((uint)local_b9);
                SetSectionBehavior(this,behavior);
              }
            }
          }
        }
      }
    }
    else if (big_value._4_4_ == 0x20008d3b) {
      bitmap_filename.m_s._3_1_ =
           ON_BinaryArchive::ReadObjectUserData
                     ((ON_BinaryArchive *)obsolete_target_point.z,(ON_Object *)this);
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk((ON_BinaryArchive *)obsolete_target_point.z);
    if (!bVar1) {
      bitmap_filename.m_s._3_1_ = 0;
    }
  } while (big_value._4_4_ != -1);
  bVar1 = ON_3dPoint::IsValid((ON_3dPoint *)auStack_30);
  local_11a = false;
  if (bVar1) {
    ON_Viewport::TargetPoint(&local_d8,&this->m_vp);
    local_11a = ON_3dPoint::IsUnset(&local_d8);
  }
  if (local_11a != false) {
    target_point.y = obsolete_target_point.x;
    target_point.x = _auStack_30;
    target_point.z = obsolete_target_point.y;
    ON_Viewport::SetTargetPoint(&this->m_vp,target_point);
  }
  return (bool)(bitmap_filename.m_s._3_1_ & 1);
}

Assistant:

bool ON_3dmView::Read( ON_BinaryArchive& file )
{
  // Everything in a view is in a subchunk so new records can 
  // be added to a view and old I/O code will still
  // work.
  ON_3dPoint obsolete_target_point = ON_3dPoint::UnsetPoint;
  unsigned int tcode = 0;
  ON__INT64 big_value = 0;
  int i32;
  bool rc = true;

  Default();

  while(rc) {
    rc = file.BeginRead3dmBigChunk(&tcode,&big_value);
    if (!rc)
      break;
    switch(tcode) 
    {
    case TCODE_VIEW_CPLANE:
      rc = m_cplane.Read(file);
      break;
    case TCODE_VIEW_VIEWPORT:
      rc = m_vp.Read(file)?true:false;
      break;
    case TCODE_VIEW_VIEWPORT_USERDATA:
      // 27 June 2008 Dale Lear
      //   I added support for saving userdata attached to
      //   the m_vp ON_Viewport.  Ideally, the ON_Viewport
      //   would be read by calling file.ReadObject(), but
      //   userdata support is being added years after 
      //   millions of files have been written by calling
      //   m_vp.Write()/Read().
      rc = file.ReadObjectUserData(m_vp);
      break;
    case TCODE_VIEW_SHOWCONGRID:
      m_bShowConstructionGrid = big_value?true:false;
      break;
    case TCODE_VIEW_SHOWCONAXES:
      m_bShowConstructionAxes = big_value?true:false;
      break;
    case TCODE_VIEW_SHOWWORLDAXES:
      m_bShowWorldAxes = big_value?true:false;
      break;
    case TCODE_VIEW_TRACEIMAGE:
      rc = m_trace_image.Read(file);
      break;
    case TCODE_VIEW_WALLPAPER:
      // used prior to 5 June 2003 and still written
      // after 5 June 2003 so older Rhinos/opennurbs
      // will not loose the filename information.
      {
        ON_wString bitmap_filename;
        rc = file.ReadString(bitmap_filename);
        m_wallpaper_image.m_image_file_reference.SetFullPath(bitmap_filename,false);
      }
      m_wallpaper_image.m_bGrayScale = true;
      break;
    case TCODE_VIEW_WALLPAPER_V3:
      // Added 5 June 2003 to support additional wallpaper attributes.
      rc = m_wallpaper_image.Read(file);
      break;
    case TCODE_VIEW_TARGET:
      // 13 June 2013
      // This point has been obsolete for more than 5 years 
      // and is now ignored.  The target point is on ON_Viewport.
      rc = file.ReadPoint(obsolete_target_point);
      break;
    case TCODE_VIEW_V3_DISPLAYMODE:
      if ( ON_nil_uuid == m_display_mode_id )
      {
        i32 = (int)big_value;
        ON::v3_display_mode dm = ON::V3DisplayMode(i32);
        m_display_mode_id = ON_StandardDisplayModeId::FromV3DisplayMode(dm);
      }
      break;
    case TCODE_VIEW_NAME:
      rc = file.ReadString(m_name);
      break;
    case TCODE_VIEW_POSITION:
      rc = m_position.Read(file);
      break;

    case TCODE_VIEW_ATTRIBUTES:
      {
        int major_version = 0;
        int minor_version = 0;
        rc = file.Read3dmChunkVersion(&major_version,&minor_version);
        // there are no 1.0 fields in this chunk
        while ( rc 
                && major_version == 1 && minor_version >= 1 
                && file.Archive3dmVersion() >= 4 
                && file.ArchiveOpenNURBSVersion() >= 200503170 )
        {
          // Added 23 March 2005 Dale Lear
          // 1.1 fields (there are no 1.0 fields)
          i32 = 0;
          rc = file.ReadInt( &i32 );
          if (!rc) break;
          m_view_type = ON::ViewType(i32);
          
          rc = file.ReadDouble( &m_page_settings.m_width_mm );
          if (!rc) break;

          rc = file.ReadDouble( &m_page_settings.m_height_mm );
          if (!rc) break;

          ON_UUID obsolete_parent_viewport_id;
          rc = file.ReadUuid( obsolete_parent_viewport_id );
          if (!rc) break;

          ON_BoundingBox obsolete_nested_view_position;
          rc = file.ReadBoundingBox( obsolete_nested_view_position );
          if (!rc) break;

          if ( minor_version >= 2 )
          {
            // 28 feb 2006 version 1.2 field
            rc = file.ReadUuid(m_display_mode_id);
            if (!rc) break;

            rc = m_page_settings.Read(file);
            if (!rc) break;

            if ( minor_version >= 3 )
            {
              rc = file.ReadBool(&m_bLockedProjection);
              if (!rc) break;

              if ( minor_version >= 4 )
              {
                rc = file.ReadArray(m_clipping_planes);
                if (!rc) break;
                if ( minor_version >= 5 )
                {
                  // 13 June 2013 version 1.5 field
                  rc = file.ReadUuid(m_named_view_id);
                  if (!rc) break;
                  if (minor_version >= 6)
                  {
                    // 8 Dec 2016 version 1.6 field (ALB)
                    rc = file.ReadBool(&m_bShowConstructionZAxis);
                    if (!rc) break;
                    if (minor_version >= 7)
                    {
                      // 11 May 2016 - Andy.  version 1.7 fields
                      rc = file.ReadDouble(&m_dFocalBlurDistance);
                      if (!rc) break;

                      rc = file.ReadDouble(&m_dFocalBlurAperture);
                      if (!rc) break;

                      rc = file.ReadDouble(&m_dFocalBlurJitter);
                      if (!rc) break;

                      rc = file.ReadInt((int*)&m_uFocalBlurSampleCount);
                      if (!rc) break;

                      rc = file.ReadInt((int*)&m_FocalBlurMode);
                      if (!rc) break;
                      if (minor_version >= 8)
                      {
                        // 4 August 2017 - Andy.  version 1.8 fields
                        rc = file.ReadInt(&m_sizeRendering.cx);
                        if (!rc) break;
                        rc = file.ReadInt(&m_sizeRendering.cy);
                        if (!rc) break;
                      }
                      if (minor_version >= 9)
                      {
                        // 9 July 2022 S. Baer add section behaviour
                        unsigned char c = 0;
                        rc = file.ReadChar(&c);
                        if (!rc) break;
                        SetSectionBehavior(ON::ViewSectionBehaviorFromUnsigned(c));
                      }
                    }
                  }
                }
              }
            }
          }

          // Add new information here - ask Dale Lear for help.

          break;
        }
      }
      break;
    }

    if (!file.EndRead3dmChunk())
      rc = false;
    if ( tcode == TCODE_ENDOFTABLE )
      break;
  }

  if ( obsolete_target_point.IsValid() && m_vp.TargetPoint().IsUnset() )
    m_vp.SetTargetPoint(obsolete_target_point);

  return rc;
}